

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall
fmt::v6::internal::fp::assign_with_boundaries<long_double>(fp *this,longdouble d)

{
  boundaries bVar1;
  undefined8 extraout_RDX;
  long *in_RDI;
  fp fVar2;
  fp upper;
  fp lower;
  bool is_lower_closer;
  undefined8 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff98;
  fp *in_stack_ffffffffffffffa0;
  uint local_58;
  fp local_40;
  undefined1 local_29;
  
  local_29 = assign<long_double,_0>
                       (in_stack_ffffffffffffffa0,
                        (longdouble)CONCAT28(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90));
  if ((bool)local_29) {
    fp(&local_40,*in_RDI * 4 - 1,(int)in_RDI[1] + -2);
  }
  else {
    fp(&local_40,*in_RDI * 2 - 1,(int)in_RDI[1] + -1);
  }
  fp((fp *)&stack0xffffffffffffffa0,*in_RDI * 2 + 1,(int)in_RDI[1] + -1);
  fVar2.f = (ulong)local_58;
  fVar2._8_8_ = extraout_RDX;
  fVar2 = normalize<1>((internal *)in_stack_ffffffffffffffa0,fVar2);
  bVar1.upper = fVar2.f;
  bVar1.lower = local_40.f << ((char)local_40.e - (char)fVar2.e & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }